

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O0

void htmlSaveErr(int code,xmlNodePtr node,char *extra)

{
  char *local_28;
  char *msg;
  char *extra_local;
  xmlNodePtr node_local;
  int code_local;
  
  switch(code) {
  case 0x578:
    local_28 = "string is not in UTF-8\n";
    break;
  case 0x579:
    local_28 = "invalid character value\n";
    break;
  case 0x57a:
    local_28 = "HTML has no DOCTYPE\n";
    break;
  case 0x57b:
    local_28 = "unknown encoding %s\n";
    break;
  default:
    local_28 = "unexpected error number\n";
  }
  __xmlSimpleError(7,code,node,local_28,extra);
  return;
}

Assistant:

static void
htmlSaveErr(int code, xmlNodePtr node, const char *extra)
{
    const char *msg = NULL;

    switch(code) {
        case XML_SAVE_NOT_UTF8:
	    msg = "string is not in UTF-8\n";
	    break;
	case XML_SAVE_CHAR_INVALID:
	    msg = "invalid character value\n";
	    break;
	case XML_SAVE_UNKNOWN_ENCODING:
	    msg = "unknown encoding %s\n";
	    break;
	case XML_SAVE_NO_DOCTYPE:
	    msg = "HTML has no DOCTYPE\n";
	    break;
	default:
	    msg = "unexpected error number\n";
    }
    __xmlSimpleError(XML_FROM_OUTPUT, code, node, msg, extra);
}